

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> *
DecodeAsmap(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,path path)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  byte bVar1;
  bool bVar2;
  FILE *__stream;
  long lVar3;
  Logger *pLVar4;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_RCX;
  int iVar5;
  long *in_RSI;
  int *in_R8;
  int bit;
  uint uVar6;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  int length;
  vector<bool,_std::allocator<bool>_> bits;
  string log_msg;
  undefined1 local_15c [12];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  string *local_130;
  undefined2 local_128;
  vector<bool,_std::allocator<bool>_> local_120;
  long *local_f8 [2];
  long local_e8 [14];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  __stream = fsbridge::fopen((char *)in_RSI,"rb");
  local_150 = 0;
  uStack_148 = 0;
  local_140 = 0;
  local_15c._4_8_ = __stream;
  if (__stream == (FILE *)0x0) {
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar4);
    if (bVar2) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<>(&local_78,"Failed to open asmap file from disk\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x8aa7c2;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
      ;
      source_file_00._M_len = 0x57;
      str_00._M_str = local_58._M_dataplus._M_p;
      str_00._M_len = local_58._M_string_length;
      logging_function_00._M_str = "DecodeAsmap";
      logging_function_00._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar4,str_00,logging_function_00,source_file_00,0xcb,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  else {
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    local_15c._0_4_ = (undefined4)lVar3;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,*in_RSI,in_RSI[1] + *in_RSI);
    local_128 = 0x2622;
    local_130 = (string *)local_f8;
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar4);
    if (bVar2) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,int>
                (&local_78,(tinyformat *)"Opened asmap file %s (%d bytes) from disk\n",
                 (char *)&local_130,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)local_15c,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x8aa7c2;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "DecodeAsmap";
      logging_function._M_len = 0xb;
      in_RCX = (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                *)0xb;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xd0,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0],local_e8[0] + 1);
    }
    iVar5 = 0;
    fseek(__stream,0,0);
    if (0 < (int)local_15c._0_4_) {
      do {
        AutoFile::read((AutoFile *)(local_15c + 4),(int)&local_58,(void *)0x1,(size_t)in_RCX);
        bVar1 = (byte)local_58._M_dataplus._M_p;
        uVar6 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (&local_120,(bVar1 >> (uVar6 & 0x1f) & 1) != 0);
          uVar6 = uVar6 + 1;
        } while (uVar6 != 8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < (int)local_15c._0_4_);
    }
    bVar2 = SanityCheckASMap(&local_120,0x80);
    if (!bVar2) {
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,*in_RSI,in_RSI[1] + *in_RSI);
      local_128 = 0x2622;
      local_130 = (string *)local_f8;
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                  (&local_78,(tinyformat *)"Sanity check of asmap file %s failed\n",
                   (char *)&local_130,in_RCX);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar4 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0x8aa7c2;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
        ;
        source_file_01._M_len = 0x57;
        str_01._M_str = local_58._M_dataplus._M_p;
        str_01._M_len = local_58._M_string_length;
        logging_function_01._M_str = "DecodeAsmap";
        logging_function_01._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar4,str_01,logging_function_01,source_file_01,0xda,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      goto LAB_007691ac;
    }
  }
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
LAB_007691ac:
  AutoFile::~AutoFile((AutoFile *)(local_15c + 4));
  if (local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<bool> DecodeAsmap(fs::path path)
{
    std::vector<bool> bits;
    FILE *filestr = fsbridge::fopen(path, "rb");
    AutoFile file{filestr};
    if (file.IsNull()) {
        LogPrintf("Failed to open asmap file from disk\n");
        return bits;
    }
    fseek(filestr, 0, SEEK_END);
    int length = ftell(filestr);
    LogPrintf("Opened asmap file %s (%d bytes) from disk\n", fs::quoted(fs::PathToString(path)), length);
    fseek(filestr, 0, SEEK_SET);
    uint8_t cur_byte;
    for (int i = 0; i < length; ++i) {
        file >> cur_byte;
        for (int bit = 0; bit < 8; ++bit) {
            bits.push_back((cur_byte >> bit) & 1);
        }
    }
    if (!SanityCheckASMap(bits, 128)) {
        LogPrintf("Sanity check of asmap file %s failed\n", fs::quoted(fs::PathToString(path)));
        return {};
    }
    return bits;
}